

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

int __thiscall
QWidgetLineControl::copy(QWidgetLineControl *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  QString t;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  selectedText((QWidgetLineControl *)this);
  bVar1 = QString::isEmpty((QString *)0x5da9d0);
  if ((!bVar1) && ((*(ushort *)(this + 0x50) >> 4 & 3) == 0)) {
    pQVar2 = (QString *)QGuiApplication::clipboard();
    QClipboard::setText(pQVar2,(Mode)&local_20);
  }
  QString::~QString((QString *)0x5daa0c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::copy(QClipboard::Mode mode) const
{
    QString t = selectedText();
    if (!t.isEmpty() && m_echoMode == QLineEdit::Normal) {
        QGuiApplication::clipboard()->setText(t, mode);
    }
}